

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cconv.c
# Opt level: O0

void lj_cconv_ct_init(CTState *cts,CType *d,CTSize sz,uint8_t *dp,TValue *o,MSize len)

{
  int iVar1;
  TValue *in_RCX;
  uint in_EDX;
  CTState *in_RSI;
  CType *in_RDI;
  CTState *in_R8;
  int in_R9D;
  CTState *unaff_retaddr;
  CType *in_stack_00000038;
  CTState *in_stack_00000040;
  undefined4 in_stack_ffffffffffffffc8;
  MSize in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffe8;
  
  if (in_R9D == 0) {
    memset(in_RCX,0,(ulong)in_EDX);
  }
  else if ((in_R9D == 1) &&
          (iVar1 = lj_cconv_multi_init(in_R8,(CType *)CONCAT44(1,in_stack_ffffffffffffffd0),
                                       (TValue *)
                                       CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8)
                                      ), iVar1 == 0)) {
    lj_cconv_ct_tv(in_stack_00000040,in_stack_00000038,(uint8_t *)cts,(TValue *)d,sz);
  }
  else if (*(uint *)&in_RSI->tab >> 0x1c == 3) {
    cconv_array_init(unaff_retaddr,in_RDI,(CTSize)((ulong)in_RSI >> 0x20),
                     (uint8_t *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),in_RCX,
                     (MSize)((ulong)in_R8 >> 0x20));
  }
  else {
    if (*(uint *)&in_RSI->tab >> 0x1c != 1) {
      cconv_err_initov((CTState *)CONCAT44(in_R9D,in_stack_ffffffffffffffd0),
                       (CType *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    }
    cconv_struct_init(in_RSI,(CType *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
                      (CTSize)((ulong)in_RCX >> 0x20),(uint8_t *)in_R8,
                      (TValue *)CONCAT44(in_R9D,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffcc
                     );
  }
  return;
}

Assistant:

void lj_cconv_ct_init(CTState *cts, CType *d, CTSize sz,
		      uint8_t *dp, TValue *o, MSize len)
{
  if (len == 0)
    memset(dp, 0, sz);
  else if (len == 1 && !lj_cconv_multi_init(cts, d, o))
    lj_cconv_ct_tv(cts, d, dp, o, 0);
  else if (ctype_isarray(d->info))  /* Also handles valarray init with len>1. */
    cconv_array_init(cts, d, sz, dp, o, len);
  else if (ctype_isstruct(d->info))
    cconv_struct_init(cts, d, sz, dp, o, len);
  else
    cconv_err_initov(cts, d);
}